

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O3

void __thiscall
reader_authority_suite::test_ipv6_line_3a_v4::test_method(test_ipv6_line_3a_v4 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *local_160;
  view_type *local_158;
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  char local_138 [4];
  view_type local_134;
  undefined8 *local_120;
  char *local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char **local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  view_type **local_d8;
  char *local_d0;
  char *local_c8;
  basic_authority<char> local_c0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [32];
  
  builtin_strncpy(input + 0x10,"E:FFFF:1.2.3.4]",0x10);
  builtin_strncpy(input,"[::CCCC:DDDD:EEE",0x10);
  local_c0.super_base<char,_trial::url::reader::basic_authority>.input.len_ = strlen(input);
  local_c0.super_base<char,_trial::url::reader::basic_authority>.current_token = end;
  local_c0.super_base<char,_trial::url::reader::basic_authority>.input.ptr_ = input;
  local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_ = input;
  local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ =
       local_c0.super_base<char,_trial::url::reader::basic_authority>.input.len_;
  trial::url::reader::basic_authority<char>::do_next(&local_c0);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0xb1);
  local_134.len_._4_1_ = 0;
  local_134._4_8_ = &PTR__lazy_ostream_00186288;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_158 = &local_134;
  local_134.ptr_._0_4_ =
       local_c0.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_160 = local_138;
  local_138[0] = '\x06';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_150[0] = local_c0.super_base<char,_trial::url::reader::basic_authority>.current_token ==
                 authority_host_ipv6;
  local_148 = (undefined1  [16])0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_c8 = "";
  local_d8 = &local_158;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00186618;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_160;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00186618;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_148 + 8));
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0xb2);
  local_134.len_._4_1_ = 0;
  local_134._4_8_ = &PTR__lazy_ostream_00186288;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  if (local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ == 0x1d) {
    auVar2[0] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0xd] == 'E');
    auVar2[1] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0xe] == 'E');
    auVar2[2] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0xf] == 'E');
    auVar2[3] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0x10] == ':');
    auVar2[4] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0x11] == 'F');
    auVar2[5] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0x12] == 'F');
    auVar2[6] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0x13] == 'F');
    auVar2[7] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0x14] == 'F');
    auVar2[8] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0x15] == ':');
    auVar2[9] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [0x16] == '1');
    auVar2[10] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                   [0x17] == '.');
    auVar2[0xb] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0x18] == '2');
    auVar2[0xc] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0x19] == '.');
    auVar2[0xd] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0x1a] == '3');
    auVar2[0xe] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0x1b] == '.');
    auVar2[0xf] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0x1c] == '4');
    auVar1[0] = -(*local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                 == ':');
    auVar1[1] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [1] == ':');
    auVar1[2] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [2] == 'C');
    auVar1[3] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [3] == 'C');
    auVar1[4] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [4] == 'C');
    auVar1[5] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [5] == 'C');
    auVar1[6] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [6] == ':');
    auVar1[7] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [7] == 'D');
    auVar1[8] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [8] == 'D');
    auVar1[9] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [9] == 'D');
    auVar1[10] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                   [10] == 'D');
    auVar1[0xb] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xb] == ':');
    auVar1[0xc] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xc] == 'E');
    auVar1[0xd] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xd] == 'E');
    auVar1[0xe] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xe] == 'E');
    auVar1[0xf] = -(local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xf] == 'E');
    auVar1 = auVar1 & auVar2;
    local_150[0] = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    local_150[0] = false;
  }
  local_148 = (undefined1  [16])0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_c8 = "";
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00186598;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_158;
  local_160 = "::CCCC:DDDD:EEEE:FFFF:1.2.3.4";
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00186918;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_160;
  local_158 = &local_c0.super_base<char,_trial::url::reader::basic_authority>.current_view;
  boost::test_tools::tt_detail::report_assertion
            (local_150,(undefined1 *)((long)&local_134.ptr_ + 4),&local_d0,0xb2,2,2,2,
             "reader.literal()",&local_f0,"\"::CCCC:DDDD:EEEE:FFFF:1.2.3.4\"",&local_110);
  boost::detail::shared_count::~shared_count((shared_count *)(local_148 + 8));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_3a_v4)
{
    const char input[] = "[::CCCC:DDDD:EEEE:FFFF:1.2.3.4]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "::CCCC:DDDD:EEEE:FFFF:1.2.3.4");
}